

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_AST.h
# Opt level: O1

Value * __thiscall
soul::heart::ArrayElement::getAsConstant(Value *__return_storage_ptr__,ArrayElement *this)

{
  Expression *pEVar1;
  size_t sVar2;
  Value indexValue;
  Value parentValue;
  Value local_d0;
  undefined1 local_90 [56];
  Value local_58;
  
  (*(((this->parent).object)->super_Object)._vptr_Object[7])(&local_58);
  if ((local_58.type.category != invalid) &&
     ((local_58.type.category != array || (local_58.type.boundingSize != 0)))) {
    pEVar1 = (this->dynamicIndex).object;
    sVar2 = this->fixedStartIndex;
    if (this->fixedEndIndex - sVar2 != 1 && pEVar1 == (Expression *)0x0) {
      soul::Value::getSlice(__return_storage_ptr__,&local_58,sVar2,this->fixedEndIndex);
      goto LAB_0024675c;
    }
    if (pEVar1 == (Expression *)0x0) {
      SubElementPath::SubElementPath((SubElementPath *)&local_d0,sVar2);
      soul::Value::getSubElement(__return_storage_ptr__,&local_58,(SubElementPath *)&local_d0);
      local_d0.type.boundingSize = 0;
      local_d0.type.arrayElementBoundingSize = 0;
      if ((Structure *)0x4 < local_d0.type.structure.object) {
        if ((LazyAllocatedData *)local_d0.type._0_8_ != (LazyAllocatedData *)0x0) {
          operator_delete__((void *)local_d0.type._0_8_);
        }
        local_d0.type._0_8_ = &local_d0.allocatedData;
        local_d0.type.structure.object = (Structure *)0x4;
      }
      goto LAB_0024675c;
    }
    (*(pEVar1->super_Object)._vptr_Object[7])(&local_d0);
    if (local_d0.type.category != invalid) {
      soul::Value::getData((PackedData *)local_90,&local_d0);
      sVar2 = soul::Value::PackedData::getAsInt64((PackedData *)local_90);
      if (-1 < (long)sVar2) {
        SubElementPath::SubElementPath((SubElementPath *)local_90,sVar2);
        soul::Value::getSubElement(__return_storage_ptr__,&local_58,(SubElementPath *)local_90);
        local_90._8_8_ = (uint8_t *)0x0;
        if (4 < (ulong)local_90._16_8_) {
          if ((Type *)local_90._0_8_ != (Type *)0x0) {
            operator_delete__((void *)local_90._0_8_);
          }
          local_90._0_8_ = local_90 + 0x18;
          local_90._16_8_ = 4;
        }
        soul::Value::~Value(&local_d0);
        goto LAB_0024675c;
      }
    }
    soul::Value::~Value(&local_d0);
  }
  (__return_storage_ptr__->type).structure.object = (Structure *)0x0;
  (__return_storage_ptr__->allocatedData).allocatedSize = 0;
  (__return_storage_ptr__->type).category = invalid;
  (__return_storage_ptr__->type).arrayElementCategory = invalid;
  (__return_storage_ptr__->type).isRef = false;
  (__return_storage_ptr__->type).isConstant = false;
  (__return_storage_ptr__->type).primitiveType = invalid;
  (__return_storage_ptr__->type).boundingSize = 0;
  (__return_storage_ptr__->type).arrayElementBoundingSize = 0;
  (__return_storage_ptr__->allocatedData).allocatedData.items =
       (uchar *)(__return_storage_ptr__->allocatedData).allocatedData.space;
  (__return_storage_ptr__->allocatedData).allocatedData.numActive = 0;
  (__return_storage_ptr__->allocatedData).allocatedData.numAllocated = 8;
LAB_0024675c:
  soul::Value::~Value(&local_58);
  return __return_storage_ptr__;
}

Assistant:

Value getAsConstant() const override
        {
            auto parentValue = parent->getAsConstant();

            if (parentValue.isValid() && ! parentValue.getType().isUnsizedArray())
            {
                if (isSlice())
                    return parentValue.getSlice (fixedStartIndex, fixedEndIndex);

                if (dynamicIndex == nullptr)
                    return parentValue.getSubElement (fixedStartIndex);

                auto indexValue = dynamicIndex->getAsConstant();

                if (indexValue.isValid())
                {
                    auto index = indexValue.getAsInt64();

                    if (index >= 0)
                        return parentValue.getSubElement ((size_t) index);
                }
            }

            return {};
        }